

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlInitialize(Ssw_Sml_t *p,int fInit)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  pAVar1 = p->pAig;
  if (fInit == 0) {
    pVVar2 = pAVar1->vCis;
    if (0 < pVVar2->nSize) {
      lVar5 = 0;
      do {
        Ssw_SmlAssignRandom(p,(Aig_Obj_t *)pVVar2->pArray[lVar5]);
        lVar5 = lVar5 + 1;
        pVVar2 = p->pAig->vCis;
      } while (lVar5 < pVVar2->nSize);
    }
  }
  else {
    if (pAVar1->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x385,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    if (pAVar1->nObjs[2] < pAVar1->nRegs) {
      __assert_fail("Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x386,"void Ssw_SmlInitialize(Ssw_Sml_t *, int)");
    }
    if (0 < pAVar1->nTruePis) {
      lVar5 = 0;
      do {
        if (pAVar1->vCis->nSize <= lVar5) goto LAB_006b2e08;
        Ssw_SmlAssignRandom(p,(Aig_Obj_t *)pAVar1->vCis->pArray[lVar5]);
        lVar5 = lVar5 + 1;
        pAVar1 = p->pAig;
      } while (lVar5 < pAVar1->nTruePis);
      if (pAVar1->nRegs < 1) {
        return;
      }
    }
    iVar4 = 0;
    do {
      uVar3 = pAVar1->nTruePis + iVar4;
      if (((int)uVar3 < 0) || (pAVar1->vCis->nSize <= (int)uVar3)) {
LAB_006b2e08:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ssw_SmlObjAssignConst(p,(Aig_Obj_t *)pAVar1->vCis->pArray[uVar3],0,0);
      iVar4 = iVar4 + 1;
      pAVar1 = p->pAig;
    } while (iVar4 < pAVar1->nRegs);
  }
  return;
}

Assistant:

void Ssw_SmlInitialize( Ssw_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) <= Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlAssignRandom( p, pObj );
    }
}